

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

void sx__coro_invoke(sx_coro_context *ctx,sx_fiber_cb *callback,void *user)

{
  uint uVar1;
  int iVar2;
  sx_pool *psVar3;
  sx__pool_page *psVar4;
  sx__coro_state *psVar5;
  code *pcVar6;
  _Bool _Var7;
  sx__pool_page *psVar8;
  long lVar9;
  sx__pool_page *psVar10;
  sx_fiber_t pvVar11;
  ulong uVar12;
  uint32_t line;
  void ***__s;
  long lVar13;
  
  psVar3 = ctx->coro_pool;
  for (psVar8 = psVar3->pages; psVar8 != (sx__pool_page *)0x0; psVar8 = psVar8->next) {
    if (0 < psVar8->iter) goto LAB_0010ce5f;
  }
  iVar2 = psVar3->item_sz;
  uVar1 = psVar3->capacity;
  uVar12 = (ulong)uVar1;
  lVar13 = (long)(int)uVar1;
  psVar8 = (sx__pool_page *)
           (*ctx->alloc->alloc_cb)
                     ((void *)0x0,((long)iVar2 + 8) * lVar13 + 0x20,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      "void sx__coro_invoke(sx_coro_context *, sx_fiber_cb *, void *)",0xda,
                      ctx->alloc->user_data);
  if (psVar8 == (sx__pool_page *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
               0x3e);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x3e,"Out of memory");
    pcVar6 = (code *)swi(3);
    (*pcVar6)();
    return;
  }
  psVar8->iter = uVar1;
  psVar8->ptrs = &psVar8[1].ptrs;
  __s = &psVar8[1].ptrs + lVar13;
  psVar8->buff = (uint8_t *)__s;
  psVar8->next = (sx__pool_page *)0x0;
  if (0 < (int)uVar1) {
    lVar9 = 0;
    do {
      lVar13 = lVar13 + -1;
      psVar8->ptrs[lVar13] = psVar8->buff + lVar9;
      lVar9 = lVar9 + iVar2;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    __s = (void ***)psVar8->buff;
  }
  memset(__s,0,(long)(int)(uVar1 * iVar2));
  psVar4 = psVar3->pages;
  do {
    psVar10 = psVar4;
    psVar4 = psVar10->next;
  } while (psVar4 != (sx__pool_page *)0x0);
  psVar10->next = psVar8;
LAB_0010ce5f:
  psVar8 = ctx->coro_pool->pages;
  do {
    iVar2 = psVar8->iter;
    if (iVar2 != 0) {
      if (0 < iVar2) {
        psVar8->iter = iVar2 - 1U;
        psVar5 = (sx__coro_state *)psVar8->ptrs[iVar2 - 1U];
        if (psVar5 == (sx__coro_state *)0x0) {
          sx__mem_run_fail_callback
                    ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                     0xdc);
          line = 0xdc;
LAB_0010cf4d:
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c"
                            ,line,"Out of memory");
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        if (psVar5->init == false) {
          _Var7 = sx_fiber_stack_init(&psVar5->stack_mem,ctx->stack_sz);
          if (!_Var7) {
            sx__mem_run_fail_callback
                      ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                       0xe3);
            line = 0xe3;
            goto LAB_0010cf4d;
          }
          psVar5->init = true;
        }
        pvVar11 = (sx_fiber_t)
                  make_fcontext((psVar5->stack_mem).sptr,(psVar5->stack_mem).ssize,callback);
        psVar5->fiber = pvVar11;
        psVar5->callback = callback;
        psVar5->user = user;
        if (ctx->run_list_last != (sx__coro_state *)0x0) {
          ctx->run_list_last->next = psVar5;
          psVar5->prev = ctx->run_list_last;
        }
        ctx->run_list_last = psVar5;
        if (ctx->run_list == (sx__coro_state *)0x0) {
          ctx->run_list = psVar5;
        }
        ctx->cur_coro = psVar5;
        pvVar11 = (sx_fiber_t)jump_fcontext(psVar5->fiber);
        psVar5->fiber = pvVar11;
        return;
      }
      break;
    }
    psVar8 = psVar8->next;
  } while (psVar8 != (sx__pool_page *)0x0);
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0x8f,"capacity is full");
  pcVar6 = (code *)swi(3);
  (*pcVar6)();
  return;
}

Assistant:

void sx__coro_invoke(sx_coro_context* ctx, sx_fiber_cb* callback, void* user)
{
    sx__coro_state* fs = sx_pool_new_and_grow(ctx->coro_pool, ctx->alloc);
    if (!fs) {
        sx_out_of_memory();
        return;
    }

    // Initialize stack memory if not initilized
    if (!fs->init) {
        if (!sx_fiber_stack_init(&fs->stack_mem, ctx->stack_sz)) {
            sx_out_of_memory();
            return;
        }
        fs->init = true;
    }

    fs->fiber = sx_fiber_create(fs->stack_mem, callback);
    fs->callback = callback;
    fs->user = user;
    // Add to the end of the list
    sx__coro_add_list(&ctx->run_list, &ctx->run_list_last, fs);

    ctx->cur_coro = fs;
    fs->fiber = sx_fiber_switch(fs->fiber, user).from;
}